

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::initialize(MidiOutAlsa *this,string *clientName)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *pvVar3;
  string *psVar4;
  string local_a8;
  string local_88;
  int local_64;
  undefined8 *puStack_60;
  int result;
  AlsaMidiData *data;
  string local_48;
  int local_24;
  undefined8 uStack_20;
  int result1;
  snd_seq_t *seq;
  string *clientName_local;
  MidiOutAlsa *this_local;
  
  seq = (snd_seq_t *)clientName;
  clientName_local = (string *)this;
  local_24 = snd_seq_open(&stack0xffffffffffffffe0,"default",1);
  uVar1 = uStack_20;
  if (local_24 < 0) {
    psVar4 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    std::__cxx11::string::operator=
              ((string *)psVar4,
               "MidiOutAlsa::initialize: error creating ALSA sequencer client object.");
    std::__cxx11::string::string((string *)&local_48,(string *)psVar4);
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    snd_seq_set_client_name(uVar1,uVar2);
    puStack_60 = (undefined8 *)operator_new(0x58);
    *puStack_60 = uStack_20;
    *(undefined4 *)(puStack_60 + 1) = 0xffffffff;
    *(undefined4 *)((long)puStack_60 + 0xc) = 0xffffffff;
    *(undefined4 *)(puStack_60 + 4) = 0x20;
    puStack_60[3] = 0;
    puStack_60[5] = 0;
    local_64 = snd_midi_event_new(*(undefined4 *)(puStack_60 + 4),puStack_60 + 3);
    if (local_64 < 0) {
      if (puStack_60 != (undefined8 *)0x0) {
        operator_delete(puStack_60,0x58);
      }
      psVar4 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar4,
                 "MidiOutAlsa::initialize: error initializing MIDI event parser!\n\n");
      std::__cxx11::string::string((string *)&local_88,(string *)psVar4);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      pvVar3 = malloc((ulong)*(uint *)(puStack_60 + 4));
      puStack_60[5] = pvVar3;
      if (puStack_60[5] == 0) {
        if (puStack_60 != (undefined8 *)0x0) {
          operator_delete(puStack_60,0x58);
        }
        psVar4 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        std::__cxx11::string::operator=
                  ((string *)psVar4,"MidiOutAlsa::initialize: error allocating buffer memory!\n\n");
        std::__cxx11::string::string((string *)&local_a8,(string *)psVar4);
        MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        snd_midi_event_init(puStack_60[3]);
        (this->super_MidiOutApi).super_MidiApi.apiData_ = puStack_60;
      }
    }
  }
  return;
}

Assistant:

void MidiOutAlsa :: initialize( const std::string& clientName )
{
  // Set up the ALSA sequencer client.
  snd_seq_t *seq;
  int result1 = snd_seq_open( &seq, "default", SND_SEQ_OPEN_OUTPUT, SND_SEQ_NONBLOCK );
  if ( result1 < 0 ) {
    errorString_ = "MidiOutAlsa::initialize: error creating ALSA sequencer client object.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Set client name.
  snd_seq_set_client_name( seq, clientName.c_str() );

  // Save our api-specific connection information.
  AlsaMidiData *data = (AlsaMidiData *) new AlsaMidiData;
  data->seq = seq;
  data->portNum = -1;
  data->vport = -1;
  data->bufferSize = 32;
  data->coder = 0;
  data->buffer = 0;
  int result = snd_midi_event_new( data->bufferSize, &data->coder );
  if ( result < 0 ) {
    delete data;
    errorString_ = "MidiOutAlsa::initialize: error initializing MIDI event parser!\n\n";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }
  data->buffer = (unsigned char *) malloc( data->bufferSize );
  if ( data->buffer == NULL ) {
    delete data;
    errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
    error( RtMidiError::MEMORY_ERROR, errorString_ );
    return;
  }
  snd_midi_event_init( data->coder );
  apiData_ = (void *) data;
}